

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O1

tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym> * __thiscall
pstack::Procman::Process::resolveSymbolDetail
          (tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym>
           *__return_storage_ptr__,Process *this,char *name,bool includeDebug,
          function<bool_(std::basic_string_view<char,_std::char_traits<char>_>)> *match)

{
  undefined4 uVar1;
  _Any_data *p_Var2;
  _Any_data *p_Var3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  Exception *this_00;
  Exception *rhs;
  undefined7 in_register_00000009;
  int iVar6;
  bool bVar7;
  undefined1 local_268 [16];
  _func_int **local_258;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  sptr local_a8;
  _Rb_tree_node_base *local_98;
  _Any_data *local_90;
  undefined6 local_88;
  short sStack_82;
  undefined8 uStack_80;
  _func_int **local_78 [2];
  Process *local_68;
  undefined4 local_5c;
  char *local_58;
  char *name_local;
  sptr obj;
  allocator<char> local_31;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,includeDebug);
  p_Var5 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98 = &(this->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar7 = p_Var5 == local_98;
  obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  local_68 = this;
  local_58 = name;
  p_Var3 = (_Any_data *)match;
  p_Var2 = local_90;
  do {
    local_90 = p_Var3;
    if (bVar7) {
LAB_001284b3:
      local_90 = p_Var2;
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset((Exception *)local_268,0,0x1a0);
      Exception::Exception((Exception *)local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_268 + 8),"symbol ",7);
      rhs = Exception::operator<<((Exception *)local_268,&local_58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&rhs->str," not found",10);
      Exception::Exception(this_00,rhs);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    local_268._8_8_ = p_Var5[1]._M_parent;
    local_268._0_8_ = p_Var5[1]._M_left;
    if (*(long *)(local_90 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    bVar4 = (**(code **)((long)local_90 + 0x18))
                      (local_90,(basic_string_view<char,_std::char_traits<char>_> *)local_268);
    iVar6 = 3;
    if (bVar4) {
      MappedObject::object((MappedObject *)&name_local,(Context *)&p_Var5[1]._M_parent);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,local_58,
                 (allocator<char> *)&(((MappedObject *)local_c8)->name_).field_2);
      pstack::Elf::Object::findDynamicSymbol((string *)local_268);
      if ((_func_int ***)CONCAT26(sStack_82,local_88) != local_78) {
        operator_delete((_func_int ***)CONCAT26(sStack_82,local_88),(long)local_78[0] + 1);
      }
      if (local_268._6_2_ == 0) {
        iVar6 = 0;
        if ((char)local_5c != '\0') {
          MappedObject::object((MappedObject *)local_c8,(Context *)&p_Var5[1]._M_parent);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&(((MappedObject *)local_c8)->name_).field_2,local_58,&local_31);
          pstack::Elf::Object::findDebugSymbol((string *)&local_88);
          if ((sptr *)local_b8._M_allocated_capacity != &((MappedObject *)local_c8)->objptr_) {
            operator_delete((void *)local_b8._M_allocated_capacity,
                            (ulong)(local_a8.
                                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
          }
          if (sStack_82 != 0) {
            obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi[1]._vptr__Sp_counted_base = local_78[0];
            (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_vptr__Sp_counted_base = (_func_int **)CONCAT26(sStack_82,local_88);
            (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count = (undefined4)uStack_80;
            (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_weak_count = uStack_80._4_4_;
            uVar1 = *(undefined4 *)&p_Var5[1].field_0x4;
            obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi[1]._M_use_count = p_Var5[1]._M_color;
            obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi[1]._M_weak_count = uVar1;
            obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi[2]._vptr__Sp_counted_base = (_func_int **)name_local;
            *(element_type **)
             &obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[2]._M_use_count =
                 obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 8) =
                     *(int *)(obj.
                              super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 8) =
                     *(int *)(obj.
                              super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8) + 1;
              }
            }
            iVar6 = 1;
          }
        }
      }
      else {
        obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
        ._vptr__Sp_counted_base = local_258;
        (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base = (_func_int **)local_268._0_8_;
        (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count = local_268._8_4_;
        (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_weak_count = local_268._12_4_;
        uVar1 = *(undefined4 *)&p_Var5[1].field_0x4;
        obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
        ._M_use_count = p_Var5[1]._M_color;
        obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
        ._M_weak_count = uVar1;
        obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
        ._vptr__Sp_counted_base = (_func_int **)name_local;
        *(element_type **)
         &obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          [2]._M_use_count =
             obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar6 = 1;
        if (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 8) = *(int *)(obj.
                                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 8) = *(int *)(obj.
                                    super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 8) + 1;
          }
        }
      }
      if (obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if ((iVar6 != 3) && (iVar6 != 0)) {
      p_Var2 = local_90;
      if (!bVar7) {
        return (tuple<std::shared_ptr<pstack::Elf::Object>,_unsigned_long,_Elf64_Sym> *)
               obj.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      }
      goto LAB_001284b3;
    }
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    bVar7 = p_Var5 == local_98;
    p_Var3 = local_90;
    p_Var2 = local_90;
  } while( true );
}

Assistant:

std::tuple<Elf::Object::sptr, Elf::Addr, Elf::Sym>
Process::resolveSymbolDetail(const char *name, bool includeDebug,
        std::function<bool(std::string_view)> match)
{
    for (auto &loaded : objects) {
        if (!match(loaded.second.name()))
           continue;
        auto obj = loaded.second.object(context);
        auto [sym,idx] = obj->findDynamicSymbol(name);
        if (sym.st_shndx != SHN_UNDEF)
           return std::make_tuple(obj, loaded.first, sym);
        if (includeDebug) {
           auto [sym, idx] = loaded.second.object(context)->findDebugSymbol(name);
           if (sym.st_shndx != SHN_UNDEF)
              return std::make_tuple(obj, loaded.first, sym);
        }
    }
    throw (Exception() << "symbol " << name << " not found");
}